

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_int_C.c
# Opt level: O3

int test_int_C(void)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  byte bVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  bool bVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  char *pcVar18;
  char *pcVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  int8_t y;
  char buf [256];
  ulong local_278;
  undefined1 local_270;
  undefined1 local_26f;
  undefined1 local_26e;
  undefined1 local_26d;
  undefined1 local_26c;
  undefined1 local_26b;
  undefined1 local_26a;
  undefined1 local_269;
  undefined1 local_268;
  undefined1 local_267;
  byte local_266;
  char local_265;
  int local_264;
  int local_260;
  undefined1 local_259;
  undefined1 local_258;
  undefined1 local_257;
  undefined1 local_256;
  undefined1 local_255;
  undefined1 local_254;
  undefined1 local_253;
  undefined1 local_252;
  undefined1 local_251;
  undefined1 local_250;
  undefined1 local_24f;
  undefined1 local_24e;
  char local_24d;
  char local_24c;
  char local_24b;
  char local_24a;
  char local_249;
  int local_248;
  int local_244;
  int local_240;
  int local_23c;
  int local_238;
  int local_234;
  int local_230;
  int local_22c;
  int local_228;
  int local_224;
  int local_220;
  uint local_21c;
  uint local_218;
  uint local_214;
  int local_210;
  int local_20c;
  int local_208;
  int local_204;
  int local_200;
  int local_1fc;
  int local_1f8;
  int local_1f4;
  int local_1f0;
  int local_1ec;
  int local_1e8;
  uint local_1e4;
  uint local_1e0;
  uint local_1dc;
  ulong local_1d8;
  int local_1cc;
  int local_1c8;
  uint local_1c4;
  uint local_1c0;
  uint local_1bc;
  int local_1b8;
  int local_1b4;
  int local_1b0;
  int local_1ac;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  ulong local_188;
  ulong local_180;
  ulong local_178;
  ulong local_170;
  ulong local_168;
  ulong local_160;
  ulong local_158;
  ulong local_150;
  ulong local_148;
  ulong local_140;
  char local_138;
  char cStack_137;
  char cStack_136;
  char cStack_135;
  char cStack_134;
  char cStack_133;
  char cStack_132;
  char cStack_131;
  char cStack_130;
  char cStack_12f;
  char cStack_12e;
  char cStack_12d;
  char cStack_12c;
  char cStack_12b;
  char cStack_12a;
  char cStack_129;
  char local_128;
  char cStack_127;
  char cStack_126;
  char cStack_125;
  char cStack_124;
  char cStack_123;
  char cStack_122;
  
  uVar15 = 0;
  snprintf(&local_138,0x100,"%i",0xffffffab);
  printf("C KWIML_INT_PRIi8: expected [%s], got [%s]","-85",&local_138);
  local_1ac = CONCAT13(cStack_135,CONCAT12(cStack_136,CONCAT11(cStack_137,local_138)));
  pcVar18 = ", FAILED";
  if (local_1ac == 0x35382d) {
    pcVar18 = ", PASSED";
  }
  puts(pcVar18);
  iVar11 = __isoc99_sscanf("-85","%hhi",&local_278);
  if (iVar11 == 1) {
    uVar15 = (uint)(char)local_278;
  }
  else {
    local_278 = local_278 & 0xffffffffffffff00;
  }
  uVar17 = 0;
  printf("C KWIML_INT_SCNi8: expected [%i], got [%i]",0xffffffab,(ulong)uVar15);
  local_249 = (char)local_278;
  pcVar18 = ", FAILED";
  if ((char)local_278 == -0x55) {
    pcVar18 = ", PASSED";
  }
  puts(pcVar18);
  snprintf(&local_138,0x100,"%d",0xffffffab);
  printf("C KWIML_INT_PRId8: expected [%s], got [%s]","-85",&local_138);
  local_1b0 = CONCAT13(cStack_135,CONCAT12(cStack_136,CONCAT11(cStack_137,local_138)));
  pcVar18 = ", FAILED";
  if (local_1b0 == 0x35382d) {
    pcVar18 = ", PASSED";
  }
  puts(pcVar18);
  iVar11 = __isoc99_sscanf("-85","%hhd",&local_278);
  if (iVar11 == 1) {
    uVar17 = (uint)(char)local_278;
  }
  else {
    local_278 = local_278 & 0xffffffffffffff00;
  }
  uVar13 = 0;
  printf("C KWIML_INT_SCNd8: expected [%d], got [%d]",0xffffffab,(ulong)uVar17);
  local_24a = (char)local_278;
  pcVar18 = ", FAILED";
  if ((char)local_278 == -0x55) {
    pcVar18 = ", PASSED";
  }
  puts(pcVar18);
  snprintf(&local_138,0x100,"%o",0xab);
  printf("C KWIML_INT_PRIo8: expected [%s], got [%s]","253",&local_138);
  local_1b4 = CONCAT13(cStack_135,CONCAT12(cStack_136,CONCAT11(cStack_137,local_138)));
  pcVar18 = ", FAILED";
  if (local_1b4 == 0x333532) {
    pcVar18 = ", PASSED";
  }
  puts(pcVar18);
  iVar11 = __isoc99_sscanf("253","%hho",&local_278);
  if (iVar11 == 1) {
    uVar13 = local_278 & 0xff;
  }
  else {
    local_278 = local_278 & 0xffffffffffffff00;
  }
  uVar16 = 0;
  printf("C KWIML_INT_SCNo8: expected [%o], got [%o]",0xab,uVar13);
  local_24b = (char)local_278;
  pcVar18 = ", FAILED";
  if ((char)local_278 == -0x55) {
    pcVar18 = ", PASSED";
  }
  puts(pcVar18);
  snprintf(&local_138,0x100,"%u",0xab);
  printf("C KWIML_INT_PRIu8: expected [%s], got [%s]","171",&local_138);
  local_1b8 = CONCAT13(cStack_135,CONCAT12(cStack_136,CONCAT11(cStack_137,local_138)));
  pcVar18 = ", FAILED";
  if (local_1b8 == 0x313731) {
    pcVar18 = ", PASSED";
  }
  puts(pcVar18);
  iVar11 = __isoc99_sscanf("171","%hhu",&local_278);
  if (iVar11 == 1) {
    uVar16 = local_278 & 0xff;
  }
  else {
    local_278 = local_278 & 0xffffffffffffff00;
  }
  uVar13 = 0;
  printf("C KWIML_INT_SCNu8: expected [%u], got [%u]",0xab,uVar16);
  local_265 = (char)local_278;
  pcVar18 = ", FAILED";
  if ((char)local_278 == -0x55) {
    pcVar18 = ", PASSED";
  }
  puts(pcVar18);
  snprintf(&local_138,0x100,"%x",0xab);
  printf("C KWIML_INT_PRIx8: expected [%s], got [%s]","ab",&local_138);
  local_224 = 0;
  bVar1 = CONCAT11(cStack_137,local_138) != 0x6261;
  local_266 = cStack_136 != '\0' || bVar1;
  pcVar18 = ", FAILED";
  if (cStack_136 == '\0' && !bVar1) {
    pcVar18 = ", PASSED";
  }
  puts(pcVar18);
  snprintf(&local_138,0x100,"%X",0xab);
  printf("C KWIML_INT_PRIX8: expected [%s], got [%s]","AB",&local_138);
  local_228 = 0;
  bVar1 = CONCAT11(cStack_137,local_138) != 0x4241;
  local_1d8 = CONCAT71(local_1d8._1_7_,cStack_136 != '\0' || bVar1);
  pcVar18 = ", FAILED";
  if (cStack_136 == '\0' && !bVar1) {
    pcVar18 = ", PASSED";
  }
  puts(pcVar18);
  iVar11 = __isoc99_sscanf("ab","%hhx",&local_278);
  if (iVar11 == 1) {
    uVar13 = local_278 & 0xff;
  }
  else {
    local_278 = local_278 & 0xffffffffffffff00;
  }
  uVar16 = 0;
  printf("C KWIML_INT_SCNx8: expected [%x], got [%x]",0xab,uVar13);
  local_24c = (char)local_278;
  pcVar18 = ", FAILED";
  if ((char)local_278 == -0x55) {
    pcVar18 = ", PASSED";
  }
  puts(pcVar18);
  iVar11 = __isoc99_sscanf("AB","%hhx",&local_278);
  if (iVar11 == 1) {
    uVar16 = local_278 & 0xff;
  }
  else {
    local_278 = local_278 & 0xffffffffffffff00;
  }
  uVar15 = 0;
  printf("C KWIML_INT_SCNx8: expected [%X], got [%X]",0xab,uVar16);
  local_24d = (char)local_278;
  pcVar18 = ", FAILED";
  if ((char)local_278 == -0x55) {
    pcVar18 = ", PASSED";
  }
  puts(pcVar18);
  snprintf(&local_138,0x100,"%i",0xffffab00);
  printf("C KWIML_INT_PRIi16: expected [%s], got [%s]","-21760",&local_138);
  local_22c = 0;
  bVar1 = CONCAT13(cStack_132,CONCAT12(cStack_133,CONCAT11(cStack_134,cStack_135))) != 0x303637;
  bVar2 = CONCAT13(cStack_135,CONCAT12(cStack_136,CONCAT11(cStack_137,local_138))) != 0x3731322d;
  local_267 = bVar1 || bVar2;
  pcVar18 = ", FAILED";
  if (!bVar1 && !bVar2) {
    pcVar18 = ", PASSED";
  }
  puts(pcVar18);
  iVar11 = __isoc99_sscanf("-21760","%hi",&local_278);
  if (iVar11 == 1) {
    uVar15 = (uint)(short)(ushort)local_278;
  }
  else {
    local_278 = local_278 & 0xffffffffffff0000;
  }
  uVar17 = 0;
  printf("C KWIML_INT_SCNi16: expected [%i], got [%i]",0xffffab00,(ulong)uVar15);
  local_1bc = (uint)(ushort)local_278;
  pcVar18 = ", FAILED";
  if (local_1bc == 0xab00) {
    pcVar18 = ", PASSED";
  }
  puts(pcVar18);
  snprintf(&local_138,0x100,"%d",0xffffab00);
  printf("C KWIML_INT_PRId16: expected [%s], got [%s]","-21760",&local_138);
  local_230 = 0;
  bVar1 = CONCAT13(cStack_132,CONCAT12(cStack_133,CONCAT11(cStack_134,cStack_135))) != 0x303637;
  bVar2 = CONCAT13(cStack_135,CONCAT12(cStack_136,CONCAT11(cStack_137,local_138))) != 0x3731322d;
  local_268 = bVar1 || bVar2;
  pcVar18 = ", FAILED";
  if (!bVar1 && !bVar2) {
    pcVar18 = ", PASSED";
  }
  puts(pcVar18);
  iVar11 = __isoc99_sscanf("-21760","%hd",&local_278);
  if (iVar11 == 1) {
    uVar17 = (uint)(short)(ushort)local_278;
  }
  else {
    local_278 = local_278 & 0xffffffffffff0000;
  }
  uVar13 = 0;
  printf("C KWIML_INT_SCNd16: expected [%d], got [%d]",0xffffab00,(ulong)uVar17);
  local_214 = (uint)(ushort)local_278;
  pcVar18 = ", FAILED";
  if (local_214 == 0xab00) {
    pcVar18 = ", PASSED";
  }
  puts(pcVar18);
  snprintf(&local_138,0x100,"%o",0xab00);
  printf("C KWIML_INT_PRIo16: expected [%s], got [%s]","125400",&local_138);
  local_234 = 0;
  bVar1 = CONCAT13(cStack_132,CONCAT12(cStack_133,CONCAT11(cStack_134,cStack_135))) != 0x303034;
  bVar2 = CONCAT13(cStack_135,CONCAT12(cStack_136,CONCAT11(cStack_137,local_138))) != 0x34353231;
  local_269 = bVar1 || bVar2;
  pcVar18 = ", FAILED";
  if (!bVar1 && !bVar2) {
    pcVar18 = ", PASSED";
  }
  puts(pcVar18);
  iVar11 = __isoc99_sscanf("125400","%ho",&local_278);
  if (iVar11 == 1) {
    uVar13 = local_278 & 0xffff;
  }
  else {
    local_278 = local_278 & 0xffffffffffff0000;
  }
  uVar16 = 0;
  printf("C KWIML_INT_SCNo16: expected [%o], got [%o]",0xab00,uVar13);
  local_218 = (uint)(ushort)local_278;
  pcVar18 = ", FAILED";
  if (local_218 == 0xab00) {
    pcVar18 = ", PASSED";
  }
  puts(pcVar18);
  snprintf(&local_138,0x100,"%u",0xab00);
  printf("C KWIML_INT_PRIu16: expected [%s], got [%s]","43776",&local_138);
  local_1e8 = 0;
  bVar1 = CONCAT11(cStack_133,cStack_134) != 0x36;
  bVar2 = CONCAT13(cStack_135,CONCAT12(cStack_136,CONCAT11(cStack_137,local_138))) != 0x37373334;
  local_26a = bVar1 || bVar2;
  pcVar18 = ", FAILED";
  if (!bVar1 && !bVar2) {
    pcVar18 = ", PASSED";
  }
  puts(pcVar18);
  iVar11 = __isoc99_sscanf("43776","%hu",&local_278);
  if (iVar11 == 1) {
    uVar16 = local_278 & 0xffff;
  }
  else {
    local_278 = local_278 & 0xffffffffffff0000;
  }
  uVar13 = 0;
  printf("C KWIML_INT_SCNu16: expected [%u], got [%u]",0xab00,uVar16);
  local_1c0 = (uint)(ushort)local_278;
  pcVar18 = ", FAILED";
  if (local_1c0 == 0xab00) {
    pcVar18 = ", PASSED";
  }
  puts(pcVar18);
  snprintf(&local_138,0x100,"%x",0xab00);
  printf("C KWIML_INT_PRIx16: expected [%s], got [%s]","ab00",&local_138);
  local_1ec = 0;
  bVar1 = CONCAT13(cStack_135,CONCAT12(cStack_136,CONCAT11(cStack_137,local_138))) != 0x30306261;
  local_26b = cStack_134 != '\0' || bVar1;
  pcVar18 = ", FAILED";
  if (cStack_134 == '\0' && !bVar1) {
    pcVar18 = ", PASSED";
  }
  puts(pcVar18);
  iVar11 = __isoc99_sscanf("ab00","%hx",&local_278);
  if (iVar11 == 1) {
    uVar13 = local_278 & 0xffff;
  }
  else {
    local_278 = local_278 & 0xffffffffffff0000;
  }
  uVar16 = 0;
  printf("C KWIML_INT_SCNx16: expected [%x], got [%x]",0xab00,uVar13);
  local_1c4 = (uint)(ushort)local_278;
  pcVar18 = ", FAILED";
  if (local_1c4 == 0xab00) {
    pcVar18 = ", PASSED";
  }
  puts(pcVar18);
  snprintf(&local_138,0x100,"%X",0xab00);
  printf("C KWIML_INT_PRIX16: expected [%s], got [%s]","AB00",&local_138);
  local_238 = 0;
  bVar1 = CONCAT13(cStack_135,CONCAT12(cStack_136,CONCAT11(cStack_137,local_138))) != 0x30304241;
  local_26c = cStack_134 != '\0' || bVar1;
  pcVar18 = ", FAILED";
  if (cStack_134 == '\0' && !bVar1) {
    pcVar18 = ", PASSED";
  }
  puts(pcVar18);
  iVar11 = __isoc99_sscanf("AB00","%hx",&local_278);
  if (iVar11 == 1) {
    uVar16 = local_278 & 0xffff;
  }
  else {
    local_278 = local_278 & 0xffffffffffff0000;
  }
  uVar15 = 0;
  printf("C KWIML_INT_SCNx16: expected [%X], got [%X]",0xab00,uVar16);
  local_21c = (uint)(ushort)local_278;
  pcVar19 = ", FAILED";
  pcVar18 = ", FAILED";
  if (local_21c == 0xab00) {
    pcVar18 = ", PASSED";
  }
  puts(pcVar18);
  snprintf(&local_138,0x100,"%i",0xab000000);
  printf("C KWIML_INT_PRIi32: expected [%s], got [%s]","-1426063360",&local_138);
  local_23c = 0;
  bVar1 = CONCAT13(cStack_12d,CONCAT12(cStack_12e,CONCAT11(cStack_12f,cStack_130))) != 0x303633;
  bVar2 = CONCAT17(cStack_131,
                   CONCAT16(cStack_132,
                            CONCAT15(cStack_133,
                                     CONCAT14(cStack_134,
                                              CONCAT13(cStack_135,
                                                       CONCAT12(cStack_136,
                                                                CONCAT11(cStack_137,local_138)))))))
          != 0x333630363234312d;
  local_26d = bVar1 || bVar2;
  if (!bVar1 && !bVar2) {
    pcVar19 = ", PASSED";
  }
  puts(pcVar19);
  iVar11 = __isoc99_sscanf("-1426063360","%i",&local_278);
  if (iVar11 == 1) {
    uVar15 = (uint)local_278;
  }
  else {
    local_278 = local_278 & 0xffffffff00000000;
  }
  printf("C KWIML_INT_SCNi32: expected [%i], got [%i]",0xab000000,(ulong)uVar15);
  local_1c8 = (uint)local_278;
  pcVar18 = ", FAILED";
  pcVar19 = ", FAILED";
  if ((uint)local_278 == -0x55000000) {
    pcVar19 = ", PASSED";
  }
  puts(pcVar19);
  snprintf(&local_138,0x100,"%d",0xab000000);
  printf("C KWIML_INT_PRId32: expected [%s], got [%s]","-1426063360",&local_138);
  local_1f0 = 0;
  bVar1 = CONCAT13(cStack_12d,CONCAT12(cStack_12e,CONCAT11(cStack_12f,cStack_130))) != 0x303633;
  bVar2 = CONCAT17(cStack_131,
                   CONCAT16(cStack_132,
                            CONCAT15(cStack_133,
                                     CONCAT14(cStack_134,
                                              CONCAT13(cStack_135,
                                                       CONCAT12(cStack_136,
                                                                CONCAT11(cStack_137,local_138)))))))
          != 0x333630363234312d;
  local_26e = bVar1 || bVar2;
  if (!bVar1 && !bVar2) {
    pcVar18 = ", PASSED";
  }
  puts(pcVar18);
  iVar11 = __isoc99_sscanf("-1426063360","%d",&local_278);
  if (iVar11 == 1) {
    uVar13 = local_278 & 0xffffffff;
  }
  else {
    local_278 = local_278 & 0xffffffff00000000;
    uVar13 = 0;
  }
  uVar15 = 0;
  printf("C KWIML_INT_SCNd32: expected [%d], got [%d]",0xab000000,uVar13);
  local_220 = (uint)local_278;
  pcVar19 = ", FAILED";
  pcVar18 = ", FAILED";
  if ((uint)local_278 == -0x55000000) {
    pcVar18 = ", PASSED";
  }
  puts(pcVar18);
  snprintf(&local_138,0x100,"%o",0xab000000);
  printf("C KWIML_INT_PRIo32: expected [%s], got [%s]","25300000000",&local_138);
  local_1f4 = 0;
  bVar1 = CONCAT13(cStack_12d,CONCAT12(cStack_12e,CONCAT11(cStack_12f,cStack_130))) != 0x303030;
  bVar2 = CONCAT17(cStack_131,
                   CONCAT16(cStack_132,
                            CONCAT15(cStack_133,
                                     CONCAT14(cStack_134,
                                              CONCAT13(cStack_135,
                                                       CONCAT12(cStack_136,
                                                                CONCAT11(cStack_137,local_138)))))))
          != 0x3030303030333532;
  local_26f = bVar1 || bVar2;
  if (!bVar1 && !bVar2) {
    pcVar19 = ", PASSED";
  }
  puts(pcVar19);
  iVar11 = __isoc99_sscanf("25300000000","%o",&local_278);
  if (iVar11 == 1) {
    uVar15 = (uint)local_278;
  }
  else {
    local_278 = local_278 & 0xffffffff00000000;
  }
  uVar17 = 0;
  printf("C KWIML_INT_SCNo32: expected [%o], got [%o]",0xab000000,(ulong)uVar15);
  local_1dc = (uint)local_278;
  pcVar18 = ", FAILED";
  if ((uint)local_278 == 0xab000000) {
    pcVar18 = ", PASSED";
  }
  puts(pcVar18);
  snprintf(&local_138,0x100,"%u",0xab000000);
  printf("C KWIML_INT_PRIu32: expected [%s], got [%s]","2868903936",&local_138);
  local_1f8 = 0;
  bVar1 = CONCAT17(cStack_12e,
                   CONCAT16(cStack_12f,
                            CONCAT15(cStack_130,
                                     CONCAT14(cStack_131,
                                              CONCAT13(cStack_132,
                                                       CONCAT12(cStack_133,
                                                                CONCAT11(cStack_134,cStack_135))))))
                  ) != 0x36333933303938;
  bVar2 = CONCAT17(cStack_131,
                   CONCAT16(cStack_132,
                            CONCAT15(cStack_133,
                                     CONCAT14(cStack_134,
                                              CONCAT13(cStack_135,
                                                       CONCAT12(cStack_136,
                                                                CONCAT11(cStack_137,local_138)))))))
          != 0x3933303938363832;
  local_270 = bVar1 || bVar2;
  pcVar18 = ", FAILED";
  if (!bVar1 && !bVar2) {
    pcVar18 = ", PASSED";
  }
  puts(pcVar18);
  iVar11 = __isoc99_sscanf("2868903936","%u",&local_278);
  if (iVar11 == 1) {
    uVar17 = (uint)local_278;
  }
  else {
    local_278 = local_278 & 0xffffffff00000000;
  }
  uVar15 = 0;
  printf("C KWIML_INT_SCNu32: expected [%u], got [%u]",0xab000000,(ulong)uVar17);
  local_1e0 = (uint)local_278;
  pcVar18 = ", FAILED";
  if ((uint)local_278 == 0xab000000) {
    pcVar18 = ", PASSED";
  }
  puts(pcVar18);
  snprintf(&local_138,0x100,"%x",0xab000000);
  printf("C KWIML_INT_PRIx32: expected [%s], got [%s]","ab000000",&local_138);
  local_1fc = 0;
  bVar1 = CONCAT17(cStack_131,
                   CONCAT16(cStack_132,
                            CONCAT15(cStack_133,
                                     CONCAT14(cStack_134,
                                              CONCAT13(cStack_135,
                                                       CONCAT12(cStack_136,
                                                                CONCAT11(cStack_137,local_138)))))))
          != 0x3030303030306261;
  local_24e = cStack_130 != '\0' || bVar1;
  pcVar18 = ", FAILED";
  if (cStack_130 == '\0' && !bVar1) {
    pcVar18 = ", PASSED";
  }
  puts(pcVar18);
  iVar11 = __isoc99_sscanf("ab000000","%x",&local_278);
  if (iVar11 == 1) {
    uVar15 = (uint)local_278;
  }
  else {
    local_278 = local_278 & 0xffffffff00000000;
  }
  uVar17 = 0;
  printf("C KWIML_INT_SCNx32: expected [%x], got [%x]",0xab000000,(ulong)uVar15);
  local_1cc = (uint)local_278;
  pcVar18 = ", FAILED";
  if ((uint)local_278 == -0x55000000) {
    pcVar18 = ", PASSED";
  }
  puts(pcVar18);
  snprintf(&local_138,0x100,"%X",0xab000000);
  printf("C KWIML_INT_PRIX32: expected [%s], got [%s]","AB000000",&local_138);
  local_200 = 0;
  bVar1 = CONCAT17(cStack_131,
                   CONCAT16(cStack_132,
                            CONCAT15(cStack_133,
                                     CONCAT14(cStack_134,
                                              CONCAT13(cStack_135,
                                                       CONCAT12(cStack_136,
                                                                CONCAT11(cStack_137,local_138)))))))
          != 0x3030303030304241;
  local_24f = cStack_130 != '\0' || bVar1;
  pcVar18 = ", FAILED";
  if (cStack_130 == '\0' && !bVar1) {
    pcVar18 = ", PASSED";
  }
  puts(pcVar18);
  iVar11 = __isoc99_sscanf("AB000000","%x",&local_278);
  if (iVar11 == 1) {
    uVar17 = (uint)local_278;
  }
  else {
    local_278 = local_278 & 0xffffffff00000000;
  }
  printf("C KWIML_INT_SCNx32: expected [%X], got [%X]",0xab000000,(ulong)uVar17);
  local_1e4 = (uint)local_278;
  pcVar18 = ", FAILED";
  if ((uint)local_278 == 0xab000000) {
    pcVar18 = ", PASSED";
  }
  puts(pcVar18);
  snprintf(&local_138,0x100,"%li",0xab00000000000000);
  printf("C KWIML_INT_PRIi64: expected [%s], got [%s]","-6124895493223874560",&local_138);
  auVar47[0] = -(cStack_133 == '8');
  auVar47[1] = -(cStack_132 == '9');
  auVar47[2] = -(cStack_131 == '5');
  auVar47[3] = -(cStack_130 == '4');
  auVar47[4] = -(cStack_12f == '9');
  auVar47[5] = -(cStack_12e == '3');
  auVar47[6] = -(cStack_12d == '2');
  auVar47[7] = -(cStack_12c == '2');
  auVar47[8] = -(cStack_12b == '3');
  auVar47[9] = -(cStack_12a == '8');
  auVar47[10] = -(cStack_129 == '7');
  auVar47[0xb] = -(local_128 == '4');
  auVar47[0xc] = -(cStack_127 == '5');
  auVar47[0xd] = -(cStack_126 == '6');
  auVar47[0xe] = -(cStack_125 == '0');
  auVar47[0xf] = -(cStack_124 == '\0');
  auVar39[0] = -(local_138 == '-');
  auVar39[1] = -(cStack_137 == '6');
  auVar39[2] = -(cStack_136 == '1');
  auVar39[3] = -(cStack_135 == '2');
  auVar39[4] = -(cStack_134 == '4');
  auVar39[5] = -(cStack_133 == '8');
  auVar39[6] = -(cStack_132 == '9');
  auVar39[7] = -(cStack_131 == '5');
  auVar39[8] = -(cStack_130 == '4');
  auVar39[9] = -(cStack_12f == '9');
  auVar39[10] = -(cStack_12e == '3');
  auVar39[0xb] = -(cStack_12d == '2');
  auVar39[0xc] = -(cStack_12c == '2');
  auVar39[0xd] = -(cStack_12b == '3');
  auVar39[0xe] = -(cStack_12a == '8');
  auVar39[0xf] = -(cStack_129 == '7');
  auVar39 = auVar39 & auVar47;
  local_204 = 0;
  local_250 = (ushort)((ushort)(SUB161(auVar39 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar39 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar39 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar39 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar39 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar39 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar39 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar39 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar39 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar39 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar39 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar39 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar39 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar39 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar39 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar39[0xf] >> 7) << 0xf) != 0xffff;
  pcVar18 = ", FAILED";
  if (!(bool)local_250) {
    pcVar18 = ", PASSED";
  }
  puts(pcVar18);
  iVar11 = __isoc99_sscanf("-6124895493223874560","%li",&local_278);
  if (iVar11 != 1) {
    local_278 = 0;
  }
  printf("C KWIML_INT_SCNi64: expected [%li], got [%li]",0xab00000000000000,local_278);
  local_140 = local_278;
  pcVar19 = ", FAILED";
  pcVar18 = ", FAILED";
  if (local_278 == 0xab00000000000000) {
    pcVar18 = ", PASSED";
  }
  puts(pcVar18);
  snprintf(&local_138,0x100,"%ld",0xab00000000000000);
  printf("C KWIML_INT_PRId64: expected [%s], got [%s]","-6124895493223874560",&local_138);
  local_1a8 = 0x3232333934353938;
  uStack_1a0 = 0x30363534373833;
  auVar40[0] = -(cStack_133 == '8');
  auVar40[1] = -(cStack_132 == '9');
  auVar40[2] = -(cStack_131 == '5');
  auVar40[3] = -(cStack_130 == '4');
  auVar40[4] = -(cStack_12f == '9');
  auVar40[5] = -(cStack_12e == '3');
  auVar40[6] = -(cStack_12d == '2');
  auVar40[7] = -(cStack_12c == '2');
  auVar40[8] = -(cStack_12b == '3');
  auVar40[9] = -(cStack_12a == '8');
  auVar40[10] = -(cStack_129 == '7');
  auVar40[0xb] = -(local_128 == '4');
  auVar40[0xc] = -(cStack_127 == '5');
  auVar40[0xd] = -(cStack_126 == '6');
  auVar40[0xe] = -(cStack_125 == '0');
  auVar40[0xf] = -(cStack_124 == '\0');
  local_198 = 0x353938343231362d;
  uStack_190 = 0x3738333232333934;
  auVar48[0] = -(local_138 == '-');
  auVar48[1] = -(cStack_137 == '6');
  auVar48[2] = -(cStack_136 == '1');
  auVar48[3] = -(cStack_135 == '2');
  auVar48[4] = -(cStack_134 == '4');
  auVar48[5] = -(cStack_133 == '8');
  auVar48[6] = -(cStack_132 == '9');
  auVar48[7] = -(cStack_131 == '5');
  auVar48[8] = -(cStack_130 == '4');
  auVar48[9] = -(cStack_12f == '9');
  auVar48[10] = -(cStack_12e == '3');
  auVar48[0xb] = -(cStack_12d == '2');
  auVar48[0xc] = -(cStack_12c == '2');
  auVar48[0xd] = -(cStack_12b == '3');
  auVar48[0xe] = -(cStack_12a == '8');
  auVar48[0xf] = -(cStack_129 == '7');
  auVar48 = auVar48 & auVar40;
  local_240 = 0;
  local_251 = (ushort)((ushort)(SUB161(auVar48 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar48 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar48 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar48 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar48 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar48 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar48 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar48 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar48 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar48 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar48 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar48 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar48 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar48 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar48 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar48[0xf] >> 7) << 0xf) != 0xffff;
  if (!(bool)local_251) {
    pcVar19 = ", PASSED";
  }
  puts(pcVar19);
  iVar11 = __isoc99_sscanf("-6124895493223874560","%ld",&local_278);
  if (iVar11 != 1) {
    local_278 = 0;
  }
  printf("C KWIML_INT_SCNd64: expected [%ld], got [%ld]",0xab00000000000000,local_278);
  local_148 = local_278;
  pcVar18 = ", FAILED";
  if (local_278 == 0xab00000000000000) {
    pcVar18 = ", PASSED";
  }
  puts(pcVar18);
  snprintf(&local_138,0x100,"%lo",0xab00000000000000);
  printf("C KWIML_INT_PRIo64: expected [%s], got [%s]","1254000000000000000000",&local_138);
  auVar49[0] = -(cStack_131 == '0');
  auVar49[1] = -(cStack_130 == '0');
  auVar49[2] = -(cStack_12f == '0');
  auVar49[3] = -(cStack_12e == '0');
  auVar49[4] = -(cStack_12d == '0');
  auVar49[5] = -(cStack_12c == '0');
  auVar49[6] = -(cStack_12b == '0');
  auVar49[7] = -(cStack_12a == '0');
  auVar49[8] = -(cStack_129 == '0');
  auVar49[9] = -(local_128 == '0');
  auVar49[10] = -(cStack_127 == '0');
  auVar49[0xb] = -(cStack_126 == '0');
  auVar49[0xc] = -(cStack_125 == '0');
  auVar49[0xd] = -(cStack_124 == '0');
  auVar49[0xe] = -(cStack_123 == '0');
  auVar49[0xf] = -(cStack_122 == '\0');
  auVar41[0] = -(local_138 == '1');
  auVar41[1] = -(cStack_137 == '2');
  auVar41[2] = -(cStack_136 == '5');
  auVar41[3] = -(cStack_135 == '4');
  auVar41[4] = -(cStack_134 == '0');
  auVar41[5] = -(cStack_133 == '0');
  auVar41[6] = -(cStack_132 == '0');
  auVar41[7] = -(cStack_131 == '0');
  auVar41[8] = -(cStack_130 == '0');
  auVar41[9] = -(cStack_12f == '0');
  auVar41[10] = -(cStack_12e == '0');
  auVar41[0xb] = -(cStack_12d == '0');
  auVar41[0xc] = -(cStack_12c == '0');
  auVar41[0xd] = -(cStack_12b == '0');
  auVar41[0xe] = -(cStack_12a == '0');
  auVar41[0xf] = -(cStack_129 == '0');
  auVar41 = auVar41 & auVar49;
  local_260 = 0;
  local_252 = (ushort)((ushort)(SUB161(auVar41 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar41 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar41 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar41 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar41 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar41 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar41 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar41 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar41 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar41 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar41 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar41 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar41 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar41 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar41 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar41[0xf] >> 7) << 0xf) != 0xffff;
  pcVar18 = ", FAILED";
  if (!(bool)local_252) {
    pcVar18 = ", PASSED";
  }
  puts(pcVar18);
  iVar11 = __isoc99_sscanf("1254000000000000000000","%lo",&local_278);
  if (iVar11 != 1) {
    local_278 = 0;
  }
  printf("C KWIML_INT_SCNo64: expected [%lo], got [%lo]",0xab00000000000000,local_278);
  local_150 = local_278;
  pcVar18 = ", FAILED";
  if (local_278 == 0xab00000000000000) {
    pcVar18 = ", PASSED";
  }
  puts(pcVar18);
  snprintf(&local_138,0x100,"%lu",0xab00000000000000);
  printf("C KWIML_INT_PRIu64: expected [%s], got [%s]","12321848580485677056",&local_138);
  auVar50[0] = -(cStack_133 == '8');
  auVar50[1] = -(cStack_132 == '4');
  auVar50[2] = -(cStack_131 == '8');
  auVar50[3] = -(cStack_130 == '5');
  auVar50[4] = -(cStack_12f == '8');
  auVar50[5] = -(cStack_12e == '0');
  auVar50[6] = -(cStack_12d == '4');
  auVar50[7] = -(cStack_12c == '8');
  auVar50[8] = -(cStack_12b == '5');
  auVar50[9] = -(cStack_12a == '6');
  auVar50[10] = -(cStack_129 == '7');
  auVar50[0xb] = -(local_128 == '7');
  auVar50[0xc] = -(cStack_127 == '0');
  auVar50[0xd] = -(cStack_126 == '5');
  auVar50[0xe] = -(cStack_125 == '6');
  auVar50[0xf] = -(cStack_124 == '\0');
  auVar42[0] = -(local_138 == '1');
  auVar42[1] = -(cStack_137 == '2');
  auVar42[2] = -(cStack_136 == '3');
  auVar42[3] = -(cStack_135 == '2');
  auVar42[4] = -(cStack_134 == '1');
  auVar42[5] = -(cStack_133 == '8');
  auVar42[6] = -(cStack_132 == '4');
  auVar42[7] = -(cStack_131 == '8');
  auVar42[8] = -(cStack_130 == '5');
  auVar42[9] = -(cStack_12f == '8');
  auVar42[10] = -(cStack_12e == '0');
  auVar42[0xb] = -(cStack_12d == '4');
  auVar42[0xc] = -(cStack_12c == '8');
  auVar42[0xd] = -(cStack_12b == '5');
  auVar42[0xe] = -(cStack_12a == '6');
  auVar42[0xf] = -(cStack_129 == '7');
  auVar42 = auVar42 & auVar50;
  local_208 = 0;
  local_253 = (ushort)((ushort)(SUB161(auVar42 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar42 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar42 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar42 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar42 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar42 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar42 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar42 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar42 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar42 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar42 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar42 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar42 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar42 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar42 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar42[0xf] >> 7) << 0xf) != 0xffff;
  pcVar18 = ", FAILED";
  if (!(bool)local_253) {
    pcVar18 = ", PASSED";
  }
  puts(pcVar18);
  iVar11 = __isoc99_sscanf("12321848580485677056","%lu",&local_278);
  if (iVar11 != 1) {
    local_278 = 0;
  }
  printf("C KWIML_INT_SCNu64: expected [%lu], got [%lu]",0xab00000000000000,local_278);
  local_158 = local_278;
  pcVar18 = ", FAILED";
  if (local_278 == 0xab00000000000000) {
    pcVar18 = ", PASSED";
  }
  puts(pcVar18);
  snprintf(&local_138,0x100,"%lx",0xab00000000000000);
  printf("C KWIML_INT_PRIx64: expected [%s], got [%s]","ab00000000000000",&local_138);
  local_20c = 0;
  bVar2 = CONCAT17(cStack_131,
                   CONCAT16(cStack_132,
                            CONCAT15(cStack_133,
                                     CONCAT14(cStack_134,
                                              CONCAT13(cStack_135,
                                                       CONCAT12(cStack_136,
                                                                CONCAT11(cStack_137,local_138)))))))
          != 0x3030303030306261;
  bVar1 = CONCAT17(cStack_129,
                   CONCAT16(cStack_12a,
                            CONCAT15(cStack_12b,
                                     CONCAT14(cStack_12c,
                                              CONCAT13(cStack_12d,
                                                       CONCAT12(cStack_12e,
                                                                CONCAT11(cStack_12f,cStack_130))))))
                  ) != 0x3030303030303030;
  local_254 = (local_128 != '\0' || bVar2) || bVar1;
  pcVar18 = ", FAILED";
  if ((local_128 == '\0' && !bVar2) && !bVar1) {
    pcVar18 = ", PASSED";
  }
  puts(pcVar18);
  snprintf(&local_138,0x100,"%lX",0xab00000000000000);
  printf("C KWIML_INT_PRIX64: expected [%s], got [%s]","AB00000000000000",&local_138);
  local_210 = 0;
  bVar2 = CONCAT17(cStack_131,
                   CONCAT16(cStack_132,
                            CONCAT15(cStack_133,
                                     CONCAT14(cStack_134,
                                              CONCAT13(cStack_135,
                                                       CONCAT12(cStack_136,
                                                                CONCAT11(cStack_137,local_138)))))))
          != 0x3030303030304241;
  bVar1 = CONCAT17(cStack_129,
                   CONCAT16(cStack_12a,
                            CONCAT15(cStack_12b,
                                     CONCAT14(cStack_12c,
                                              CONCAT13(cStack_12d,
                                                       CONCAT12(cStack_12e,
                                                                CONCAT11(cStack_12f,cStack_130))))))
                  ) != 0x3030303030303030;
  local_255 = (local_128 != '\0' || bVar2) || bVar1;
  pcVar18 = ", FAILED";
  if ((local_128 == '\0' && !bVar2) && !bVar1) {
    pcVar18 = ", PASSED";
  }
  puts(pcVar18);
  iVar11 = __isoc99_sscanf("ab00000000000000","%lx",&local_278);
  if (iVar11 != 1) {
    local_278 = 0;
  }
  printf("C KWIML_INT_SCNx64: expected [%lx], got [%lx]",0xab00000000000000,local_278);
  local_160 = local_278;
  pcVar18 = ", FAILED";
  if (local_278 == 0xab00000000000000) {
    pcVar18 = ", PASSED";
  }
  puts(pcVar18);
  iVar11 = __isoc99_sscanf("AB00000000000000","%lx",&local_278);
  if (iVar11 != 1) {
    local_278 = 0;
  }
  printf("C KWIML_INT_SCNx64: expected [%lX], got [%lX]",0xab00000000000000,local_278);
  local_168 = local_278;
  pcVar18 = ", FAILED";
  if (local_278 == 0xab00000000000000) {
    pcVar18 = ", PASSED";
  }
  puts(pcVar18);
  snprintf(&local_138,0x100,"%li",0xab00000000000000);
  printf("C KWIML_INT_PRIiPTR: expected [%s], got [%s]","-6124895493223874560",&local_138);
  auVar43[0] = -(cStack_133 == (char)local_1a8);
  auVar43[1] = -(cStack_132 == local_1a8._1_1_);
  auVar43[2] = -(cStack_131 == local_1a8._2_1_);
  auVar43[3] = -(cStack_130 == local_1a8._3_1_);
  auVar43[4] = -(cStack_12f == local_1a8._4_1_);
  auVar43[5] = -(cStack_12e == local_1a8._5_1_);
  auVar43[6] = -(cStack_12d == local_1a8._6_1_);
  auVar43[7] = -(cStack_12c == local_1a8._7_1_);
  auVar43[8] = -(cStack_12b == (char)uStack_1a0);
  auVar43[9] = -(cStack_12a == uStack_1a0._1_1_);
  auVar43[10] = -(cStack_129 == uStack_1a0._2_1_);
  auVar43[0xb] = -(local_128 == uStack_1a0._3_1_);
  auVar43[0xc] = -(cStack_127 == uStack_1a0._4_1_);
  auVar43[0xd] = -(cStack_126 == uStack_1a0._5_1_);
  auVar43[0xe] = -(cStack_125 == uStack_1a0._6_1_);
  auVar43[0xf] = -(cStack_124 == uStack_1a0._7_1_);
  auVar51[0] = -(local_138 == (char)local_198);
  auVar51[1] = -(cStack_137 == local_198._1_1_);
  auVar51[2] = -(cStack_136 == local_198._2_1_);
  auVar51[3] = -(cStack_135 == local_198._3_1_);
  auVar51[4] = -(cStack_134 == local_198._4_1_);
  auVar51[5] = -(cStack_133 == local_198._5_1_);
  auVar51[6] = -(cStack_132 == local_198._6_1_);
  auVar51[7] = -(cStack_131 == local_198._7_1_);
  auVar51[8] = -(cStack_130 == (char)uStack_190);
  auVar51[9] = -(cStack_12f == uStack_190._1_1_);
  auVar51[10] = -(cStack_12e == uStack_190._2_1_);
  auVar51[0xb] = -(cStack_12d == uStack_190._3_1_);
  auVar51[0xc] = -(cStack_12c == uStack_190._4_1_);
  auVar51[0xd] = -(cStack_12b == uStack_190._5_1_);
  auVar51[0xe] = -(cStack_12a == uStack_190._6_1_);
  auVar51[0xf] = -(cStack_129 == uStack_190._7_1_);
  auVar51 = auVar51 & auVar43;
  local_244 = 0;
  local_256 = (ushort)((ushort)(SUB161(auVar51 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar51 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar51 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar51 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar51 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar51 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar51 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar51 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar51 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar51 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar51 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar51 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar51 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar51 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar51 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar51[0xf] >> 7) << 0xf) != 0xffff;
  pcVar18 = ", FAILED";
  if (!(bool)local_256) {
    pcVar18 = ", PASSED";
  }
  puts(pcVar18);
  iVar11 = __isoc99_sscanf("-6124895493223874560","%li",&local_278);
  if (iVar11 != 1) {
    local_278 = 0;
  }
  printf("C KWIML_INT_SCNiPTR: expected [%li], got [%li]",0xab00000000000000,local_278);
  local_170 = local_278;
  pcVar18 = ", FAILED";
  if (local_278 == 0xab00000000000000) {
    pcVar18 = ", PASSED";
  }
  puts(pcVar18);
  snprintf(&local_138,0x100,"%ld",0xab00000000000000);
  printf("C KWIML_INT_PRIdPTR: expected [%s], got [%s]","-6124895493223874560",&local_138);
  auVar52[0] = -((char)local_1a8 == cStack_133);
  auVar52[1] = -(local_1a8._1_1_ == cStack_132);
  auVar52[2] = -(local_1a8._2_1_ == cStack_131);
  auVar52[3] = -(local_1a8._3_1_ == cStack_130);
  auVar52[4] = -(local_1a8._4_1_ == cStack_12f);
  auVar52[5] = -(local_1a8._5_1_ == cStack_12e);
  auVar52[6] = -(local_1a8._6_1_ == cStack_12d);
  auVar52[7] = -(local_1a8._7_1_ == cStack_12c);
  auVar52[8] = -((char)uStack_1a0 == cStack_12b);
  auVar52[9] = -(uStack_1a0._1_1_ == cStack_12a);
  auVar52[10] = -(uStack_1a0._2_1_ == cStack_129);
  auVar52[0xb] = -(uStack_1a0._3_1_ == local_128);
  auVar52[0xc] = -(uStack_1a0._4_1_ == cStack_127);
  auVar52[0xd] = -(uStack_1a0._5_1_ == cStack_126);
  auVar52[0xe] = -(uStack_1a0._6_1_ == cStack_125);
  auVar52[0xf] = -(uStack_1a0._7_1_ == cStack_124);
  auVar44[0] = -((char)local_198 == local_138);
  auVar44[1] = -(local_198._1_1_ == cStack_137);
  auVar44[2] = -(local_198._2_1_ == cStack_136);
  auVar44[3] = -(local_198._3_1_ == cStack_135);
  auVar44[4] = -(local_198._4_1_ == cStack_134);
  auVar44[5] = -(local_198._5_1_ == cStack_133);
  auVar44[6] = -(local_198._6_1_ == cStack_132);
  auVar44[7] = -(local_198._7_1_ == cStack_131);
  auVar44[8] = -((char)uStack_190 == cStack_130);
  auVar44[9] = -(uStack_190._1_1_ == cStack_12f);
  auVar44[10] = -(uStack_190._2_1_ == cStack_12e);
  auVar44[0xb] = -(uStack_190._3_1_ == cStack_12d);
  auVar44[0xc] = -(uStack_190._4_1_ == cStack_12c);
  auVar44[0xd] = -(uStack_190._5_1_ == cStack_12b);
  auVar44[0xe] = -(uStack_190._6_1_ == cStack_12a);
  auVar44[0xf] = -(uStack_190._7_1_ == cStack_129);
  auVar44 = auVar44 & auVar52;
  local_198 = local_198 & 0xffffffff00000000;
  local_257 = (ushort)((ushort)(SUB161(auVar44 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar44 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar44 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar44 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar44 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar44 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar44 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar44 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar44 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar44 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar44 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar44 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar44 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar44 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar44 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar44[0xf] >> 7) << 0xf) != 0xffff;
  pcVar18 = ", FAILED";
  if (!(bool)local_257) {
    pcVar18 = ", PASSED";
  }
  puts(pcVar18);
  iVar11 = __isoc99_sscanf("-6124895493223874560","%ld",&local_278);
  if (iVar11 != 1) {
    local_278 = 0;
  }
  printf("C KWIML_INT_SCNdPTR: expected [%ld], got [%ld]",0xab00000000000000,local_278);
  local_178 = local_278;
  pcVar19 = ", FAILED";
  pcVar18 = ", FAILED";
  if (local_278 == 0xab00000000000000) {
    pcVar18 = ", PASSED";
  }
  puts(pcVar18);
  snprintf(&local_138,0x100,"%lo",0xab00000000000000);
  printf("C KWIML_INT_PRIoPTR: expected [%s], got [%s]","1254000000000000000000",&local_138);
  auVar53[0] = -(cStack_131 == '0');
  auVar53[1] = -(cStack_130 == '0');
  auVar53[2] = -(cStack_12f == '0');
  auVar53[3] = -(cStack_12e == '0');
  auVar53[4] = -(cStack_12d == '0');
  auVar53[5] = -(cStack_12c == '0');
  auVar53[6] = -(cStack_12b == '0');
  auVar53[7] = -(cStack_12a == '0');
  auVar53[8] = -(cStack_129 == '0');
  auVar53[9] = -(local_128 == '0');
  auVar53[10] = -(cStack_127 == '0');
  auVar53[0xb] = -(cStack_126 == '0');
  auVar53[0xc] = -(cStack_125 == '0');
  auVar53[0xd] = -(cStack_124 == '0');
  auVar53[0xe] = -(cStack_123 == '0');
  auVar53[0xf] = -(cStack_122 == '\0');
  auVar45[0] = -(local_138 == '1');
  auVar45[1] = -(cStack_137 == '2');
  auVar45[2] = -(cStack_136 == '5');
  auVar45[3] = -(cStack_135 == '4');
  auVar45[4] = -(cStack_134 == '0');
  auVar45[5] = -(cStack_133 == '0');
  auVar45[6] = -(cStack_132 == '0');
  auVar45[7] = -(cStack_131 == '0');
  auVar45[8] = -(cStack_130 == '0');
  auVar45[9] = -(cStack_12f == '0');
  auVar45[10] = -(cStack_12e == '0');
  auVar45[0xb] = -(cStack_12d == '0');
  auVar45[0xc] = -(cStack_12c == '0');
  auVar45[0xd] = -(cStack_12b == '0');
  auVar45[0xe] = -(cStack_12a == '0');
  auVar45[0xf] = -(cStack_129 == '0');
  auVar45 = auVar45 & auVar53;
  local_1a8 = local_1a8 & 0xffffffff00000000;
  local_258 = (ushort)((ushort)(SUB161(auVar45 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar45 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar45 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar45 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar45 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar45 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar45 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar45 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar45 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar45 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar45 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar45 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar45 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar45 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar45 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar45[0xf] >> 7) << 0xf) != 0xffff;
  if (!(bool)local_258) {
    pcVar19 = ", PASSED";
  }
  puts(pcVar19);
  iVar11 = __isoc99_sscanf("1254000000000000000000","%lo",&local_278);
  if (iVar11 != 1) {
    local_278 = 0;
  }
  printf("C KWIML_INT_SCNoPTR: expected [%lo], got [%lo]",0xab00000000000000,local_278);
  local_180 = local_278;
  pcVar18 = ", FAILED";
  if (local_278 == 0xab00000000000000) {
    pcVar18 = ", PASSED";
  }
  puts(pcVar18);
  snprintf(&local_138,0x100,"%lu",0xab00000000000000);
  printf("C KWIML_INT_PRIuPTR: expected [%s], got [%s]","12321848580485677056",&local_138);
  auVar54[0] = -(cStack_133 == '8');
  auVar54[1] = -(cStack_132 == '4');
  auVar54[2] = -(cStack_131 == '8');
  auVar54[3] = -(cStack_130 == '5');
  auVar54[4] = -(cStack_12f == '8');
  auVar54[5] = -(cStack_12e == '0');
  auVar54[6] = -(cStack_12d == '4');
  auVar54[7] = -(cStack_12c == '8');
  auVar54[8] = -(cStack_12b == '5');
  auVar54[9] = -(cStack_12a == '6');
  auVar54[10] = -(cStack_129 == '7');
  auVar54[0xb] = -(local_128 == '7');
  auVar54[0xc] = -(cStack_127 == '0');
  auVar54[0xd] = -(cStack_126 == '5');
  auVar54[0xe] = -(cStack_125 == '6');
  auVar54[0xf] = -(cStack_124 == '\0');
  auVar46[0] = -(local_138 == '1');
  auVar46[1] = -(cStack_137 == '2');
  auVar46[2] = -(cStack_136 == '3');
  auVar46[3] = -(cStack_135 == '2');
  auVar46[4] = -(cStack_134 == '1');
  auVar46[5] = -(cStack_133 == '8');
  auVar46[6] = -(cStack_132 == '4');
  auVar46[7] = -(cStack_131 == '8');
  auVar46[8] = -(cStack_130 == '5');
  auVar46[9] = -(cStack_12f == '8');
  auVar46[10] = -(cStack_12e == '0');
  auVar46[0xb] = -(cStack_12d == '4');
  auVar46[0xc] = -(cStack_12c == '8');
  auVar46[0xd] = -(cStack_12b == '5');
  auVar46[0xe] = -(cStack_12a == '6');
  auVar46[0xf] = -(cStack_129 == '7');
  auVar46 = auVar46 & auVar54;
  local_264 = 0;
  local_259 = (ushort)((ushort)(SUB161(auVar46 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar46 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar46 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar46 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar46 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar46 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar46 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar46 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar46 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar46 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar46 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar46 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar46 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar46 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar46 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar46[0xf] >> 7) << 0xf) != 0xffff;
  pcVar18 = ", FAILED";
  if (!(bool)local_259) {
    pcVar18 = ", PASSED";
  }
  puts(pcVar18);
  iVar11 = __isoc99_sscanf("12321848580485677056","%lu",&local_278);
  if (iVar11 != 1) {
    local_278 = 0;
  }
  printf("C KWIML_INT_SCNuPTR: expected [%lu], got [%lu]",0xab00000000000000,local_278);
  local_188 = local_278;
  pcVar18 = ", FAILED";
  if (local_278 == 0xab00000000000000) {
    pcVar18 = ", PASSED";
  }
  puts(pcVar18);
  snprintf(&local_138,0x100,"%lx",0xab00000000000000);
  printf("C KWIML_INT_PRIxPTR: expected [%s], got [%s]","ab00000000000000",&local_138);
  local_248 = 0;
  bVar2 = local_128 != '\0';
  bVar3 = CONCAT17(cStack_131,
                   CONCAT16(cStack_132,
                            CONCAT15(cStack_133,
                                     CONCAT14(cStack_134,
                                              CONCAT13(cStack_135,
                                                       CONCAT12(cStack_136,
                                                                CONCAT11(cStack_137,local_138)))))))
          != 0x3030303030306261;
  bVar1 = CONCAT17(cStack_129,
                   CONCAT16(cStack_12a,
                            CONCAT15(cStack_12b,
                                     CONCAT14(cStack_12c,
                                              CONCAT13(cStack_12d,
                                                       CONCAT12(cStack_12e,
                                                                CONCAT11(cStack_12f,cStack_130))))))
                  ) != 0x3030303030303030;
  pcVar18 = ", FAILED";
  if ((!bVar2 && !bVar3) && !bVar1) {
    pcVar18 = ", PASSED";
  }
  puts(pcVar18);
  iVar11 = __isoc99_sscanf("ab00000000000000","%lx",&local_278);
  if (iVar11 != 1) {
    local_278 = 0;
  }
  local_224 = CONCAT31((int3)((uint)local_224 >> 8),local_266);
  local_228 = CONCAT31((int3)((uint)local_228 >> 8),(undefined1)local_1d8);
  local_22c = CONCAT31((int3)((uint)local_22c >> 8),local_267);
  local_230 = CONCAT31((int3)((uint)local_230 >> 8),local_268);
  local_234 = CONCAT31((int3)((uint)local_234 >> 8),local_269);
  local_1e8 = CONCAT31((int3)((uint)local_1e8 >> 8),local_26a);
  local_1ec = CONCAT31((int3)((uint)local_1ec >> 8),local_26b);
  local_238 = CONCAT31((int3)((uint)local_238 >> 8),local_26c);
  local_23c = CONCAT31((int3)((uint)local_23c >> 8),local_26d);
  local_1f0 = CONCAT31((int3)((uint)local_1f0 >> 8),local_26e);
  local_1f4 = CONCAT31((int3)((uint)local_1f4 >> 8),local_26f);
  local_1f8 = CONCAT31((int3)((uint)local_1f8 >> 8),local_270);
  local_1fc = CONCAT31((int3)((uint)local_1fc >> 8),local_24e);
  local_200 = CONCAT31((int3)((uint)local_200 >> 8),local_24f);
  local_204 = CONCAT31((int3)((uint)local_204 >> 8),local_250);
  local_240 = CONCAT31((int3)((uint)local_240 >> 8),local_251);
  local_260 = CONCAT31((int3)((uint)local_260 >> 8),local_252);
  local_208 = CONCAT31((int3)((uint)local_208 >> 8),local_253);
  local_20c = CONCAT31((int3)((uint)local_20c >> 8),local_254);
  local_210 = CONCAT31((int3)((uint)local_210 >> 8),local_255);
  local_244 = CONCAT31((int3)((uint)local_244 >> 8),local_256);
  local_198 = CONCAT44(local_198._4_4_,CONCAT31((int3)(local_198 >> 8),local_257));
  local_1a8 = CONCAT44(local_1a8._4_4_,CONCAT31((int3)(local_1a8 >> 8),local_258));
  local_264 = CONCAT31((int3)((uint)local_264 >> 8),local_259);
  local_248 = CONCAT31((int3)((uint)local_248 >> 8),(bVar2 || bVar3) || bVar1);
  printf("C KWIML_INT_SCNxPTR: expected [%lx], got [%lx]",0xab00000000000000,local_278);
  uVar13 = local_278;
  pcVar19 = ", FAILED";
  pcVar18 = ", FAILED";
  if (local_278 == 0xab00000000000000) {
    pcVar18 = ", PASSED";
  }
  puts(pcVar18);
  snprintf(&local_138,0x100,"%lX",0xab00000000000000);
  printf("C KWIML_INT_PRIXPTR: expected [%s], got [%s]","AB00000000000000",&local_138);
  bVar2 = CONCAT17(cStack_131,
                   CONCAT16(cStack_132,
                            CONCAT15(cStack_133,
                                     CONCAT14(cStack_134,
                                              CONCAT13(cStack_135,
                                                       CONCAT12(cStack_136,
                                                                CONCAT11(cStack_137,local_138)))))))
          == 0x3030303030304241;
  bVar1 = CONCAT17(cStack_129,
                   CONCAT16(cStack_12a,
                            CONCAT15(cStack_12b,
                                     CONCAT14(cStack_12c,
                                              CONCAT13(cStack_12d,
                                                       CONCAT12(cStack_12e,
                                                                CONCAT11(cStack_12f,cStack_130))))))
                  ) == 0x3030303030303030;
  if ((local_128 == '\0' && bVar2) && bVar1) {
    pcVar19 = ", PASSED";
  }
  puts(pcVar19);
  iVar12 = __isoc99_sscanf("AB00000000000000","%lx",&local_278);
  iVar11 = local_220;
  if (iVar12 == 1) {
    local_1d8 = local_278;
  }
  else {
    local_1d8 = 0;
  }
  local_266 = (local_128 == '\0' && bVar2) && bVar1;
  local_267 = uVar13 == 0xab00000000000000;
  bVar20 = local_248 == 0;
  local_248 = CONCAT31(local_248._1_3_,bVar20);
  local_268 = local_188 == 0xab00000000000000;
  local_269 = local_180 == 0xab00000000000000;
  local_26a = local_178 == 0xab00000000000000;
  local_26b = local_170 == 0xab00000000000000;
  bVar21 = local_244 == 0;
  local_244 = CONCAT31(local_244._1_3_,bVar21);
  local_26c = local_168 == 0xab00000000000000;
  local_26d = local_160 == 0xab00000000000000;
  local_26e = local_150 == 0xab00000000000000;
  local_26f = local_260 == 0;
  bVar22 = local_240 == 0;
  local_240 = CONCAT31(local_240._1_3_,bVar22);
  local_270 = local_140 == 0xab00000000000000;
  local_1e4 = local_1e4 ^ 0xab000000;
  local_1e0 = local_1e0 ^ 0xab000000;
  local_1dc = local_1dc ^ 0xab000000;
  bVar23 = local_1c8 == -0x55000000;
  local_220 = CONCAT31(local_220._1_3_,bVar23);
  bVar24 = local_23c == 0;
  local_23c = CONCAT31(local_23c._1_3_,bVar24);
  bVar25 = (short)local_21c == -0x5500;
  local_21c = CONCAT31(local_21c._1_3_,bVar25);
  bVar26 = local_238 == 0;
  bVar27 = (short)local_1c4 == -0x5500;
  local_238 = CONCAT31(local_238._1_3_,bVar27);
  bVar28 = (short)local_1c0 == -0x5500;
  bVar29 = (short)local_218 == -0x5500;
  local_218 = CONCAT31(local_218._1_3_,bVar29);
  bVar30 = local_234 == 0;
  local_234 = CONCAT31(local_234._1_3_,bVar30);
  bVar31 = (short)local_214 == -0x5500;
  local_214 = CONCAT31(local_214._1_3_,bVar31);
  bVar32 = local_230 == 0;
  bVar33 = (short)local_1bc == -0x5500;
  local_230 = CONCAT31(local_230._1_3_,bVar33);
  bVar34 = local_22c == 0;
  bVar35 = local_24d == -0x55;
  local_22c = CONCAT31(local_22c._1_3_,bVar35);
  bVar36 = local_24c == -0x55;
  bVar37 = local_228 == 0;
  local_228 = CONCAT31(local_228._1_3_,bVar37);
  bVar38 = local_224 == 0;
  local_224 = CONCAT31(local_224._1_3_,bVar38);
  local_265 = local_265 == -0x55;
  bVar14 = (((local_1b4 == 0x333532 && local_24b == -0x55) && local_1b8 == 0x313731) &&
           ((local_1b0 == 0x35382d && local_24a == -0x55) &&
           (local_1ac == 0x35382d && local_249 == -0x55))) && (bool)local_265;
  bVar1 = local_1ec == 0;
  bVar2 = local_1e8 == 0;
  bVar9 = local_1dc == 0;
  bVar8 = local_1f8 == 0;
  bVar7 = local_1e0 == 0;
  bVar5 = local_1f4 == 0;
  bVar6 = local_1f0 == 0;
  bVar4 = local_1fc == 0;
  bVar3 = local_1cc == -0x55000000;
  local_260 = CONCAT31(local_260._1_3_,
                       ((local_148 == 0xab00000000000000 && (bool)local_26f) &&
                       ((((local_204 == 0 && local_200 == 0) && local_1e4 == 0) && (bool)local_270)
                       && bVar22)) && (bool)local_26e);
  bVar21 = ((((local_158 == 0xab00000000000000 && (bool)local_26d) && (bool)local_26c) &&
            ((local_20c == 0 && local_208 == 0) && local_210 == 0)) && bVar21) && (bool)local_26b;
  local_264 = CONCAT31(local_264._1_3_,
                       (((local_264 == 0 && (bool)local_268) &&
                        (((bool)local_26a && (bool)local_269) &&
                        ((int)local_1a8 == 0 && (int)local_198 == 0))) && bVar20) && (bool)local_267
                      );
  local_278 = local_1d8;
  printf("C KWIML_INT_SCNxPTR: expected [%lX], got [%lX]",0xab00000000000000,local_1d8);
  pcVar18 = ", FAILED";
  if (local_278 == 0xab00000000000000) {
    pcVar18 = ", PASSED";
  }
  bVar10 = local_278 == 0xab00000000000000 & local_266 & bVar21 & (byte)local_260 & (byte)local_264;
  puts(pcVar18);
  printf("C KWIML_INT_INT8_C: expression [%i], literal [%i]",0xffffffab,0xffffffab);
  puts(", PASSED");
  printf("C KWIML_INT_UINT8_C: expression [%u], literal [%u]",0xab,0xab);
  puts(", PASSED");
  printf("C KWIML_INT_INT16_C: expression [%i], literal [%i]",0xffffab00,0xffffab00);
  puts(", PASSED");
  printf("C KWIML_INT_UINT16_C: expression [%u], literal [%u]",0xab00,0xab00);
  puts(", PASSED");
  printf("C KWIML_INT_INT32_C: expression [%i], literal [%i]",0xab000000,0xab000000);
  puts(", PASSED");
  printf("C KWIML_INT_UINT32_C: expression [%u], literal [%u]",0xab000000,0xab000000);
  puts(", PASSED");
  printf("C KWIML_INT_INT64_C: expression [%li], literal [%li]",0xab00000000000000);
  puts(", PASSED");
  printf("C KWIML_INT_UINT64_C: expression [%lu], literal [%lu]",0xab00000000000000,
         0xab00000000000000);
  puts(", PASSED");
  return (int)((((((((((iVar11 == -0x55000000 && bVar9) && bVar8) && bVar7) && (bVar5 && bVar6)) &&
                   bVar4) && bVar3) &&
                 ((((bVar26 && bVar25) && ((bVar28 && bVar27) && (bVar1 && bVar2))) && bVar24) &&
                 bVar23)) &&
                ((((bVar32 && bVar31) && bVar30) &&
                 ((bVar34 && bVar33) && ((bVar36 && bVar35) && bVar37))) && bVar29)) &&
               (bVar14 && bVar38)) & bVar10);
}

Assistant:

int test_int_C(void)
{
  if(!test_int_format())
    {
    return 0;
    }
  return 1;
}